

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

void __thiscall RSA::encrypt(RSA *this,char *__block,int __edflag)

{
  string *this_00;
  long lVar1;
  long lVar2;
  Conversion *pCVar3;
  bool bVar4;
  iterator iVar5;
  undefined4 in_register_00000014;
  long lVar6;
  BigInt message;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BigInt local_100;
  BigInt local_e0;
  BigInt local_c0;
  string local_a0;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_80;
  string local_50;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_80,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__block[8],
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__block[8] + *(long *)(__block + 0x10)));
  std::operator+(&local_120,"_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000014,__edflag));
  this_00 = (string *)(__block + 0x28);
  std::__cxx11::string::operator=(this_00,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  lVar1 = *(long *)(__block + 0x28);
  lVar2 = *(long *)(__block + 0x30);
  lVar6 = 0;
  do {
    if (lVar2 == lVar6) {
      pCVar3 = *(Conversion **)(__block + 0x1a0);
      std::__cxx11::string::string((string *)&local_a0,this_00);
      Conversion::convert_to_num_base((BigInt *)&local_120,pCVar3,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      BigInt::operator=((BigInt *)(__block + 0x160),(BigInt *)&local_120);
      bVar4 = BigInt::operator>=((BigInt *)&local_120,(BigInt *)(__block + 0xe0));
      if (bVar4) {
        std::__cxx11::string::assign((char *)this_00);
        std::__cxx11::string::_M_assign((string *)(__block + 0x48));
        BigInt::operator=((BigInt *)(__block + 0x160),0);
        std::__cxx11::string::string((string *)this,"",(allocator *)&local_100);
      }
      else {
        BigInt::BigInt(&local_c0,(BigInt *)(__block + 0x120));
        BigInt::powMod(&local_100,(BigInt *)&local_120,&local_c0,(BigInt *)(__block + 0xe0));
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_c0);
        BigInt::operator=((BigInt *)(__block + 0x180),&local_100);
        pCVar3 = *(Conversion **)(__block + 0x1a0);
        BigInt::BigInt(&local_e0,&local_100);
        Conversion::convert_to_voacb_base_abi_cxx11_(&local_50,pCVar3,&local_e0);
        std::__cxx11::string::operator=((string *)(__block + 0x48),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_e0);
        std::__cxx11::string::string((string *)this,(string *)(__block + 0x48));
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_100);
      }
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_120);
LAB_001034f0:
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&local_80);
      return;
    }
    local_120._M_dataplus._M_p._0_1_ = *(undefined1 *)(lVar1 + lVar6);
    iVar5 = std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::find(&local_80,(key_type *)&local_120);
    if ((_Rb_tree_header *)iVar5._M_node == &local_80._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::assign((char *)this_00);
      std::__cxx11::string::_M_assign((string *)(__block + 0x48));
      BigInt::operator=((BigInt *)(__block + 0x160),0);
      std::__cxx11::string::string((string *)this,"",(allocator *)&local_100);
      goto LAB_001034f0;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

string RSA::encrypt(string pPlainText) {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());
    plainText = "_" + pPlainText; //! some character may be zero

    for (auto plain_char:plainText)
        if (vocab_set.find(plain_char) == vocab_set.end()) {
            cipherText = plainText = "Some letter in the plain text is not contained in vocabulary";
            plain_BigInt = 0;
            return "";
        }
    BigInt message = conversion->convert_to_num_base(plainText);

    plain_BigInt = message;

    if (message >= n) {
        cipherText = plainText = "The message is to large to fit into n space";
        plain_BigInt = 0;
        return "";
    }

    BigInt cipher = message.powMod(e, n);
    cipher_BigInt = cipher;
    cipherText = conversion->convert_to_voacb_base(cipher);
    return cipherText;
}